

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.hpp
# Opt level: O3

void __thiscall SimpleWeb::Request::Request(Request *this)

{
  allocator<char> local_39;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &(this->method).field_2;
  (this->method)._M_dataplus._M_p = (pointer)local_38;
  (this->method)._M_string_length = 0;
  (this->method).field_2._M_local_buf[0] = '\0';
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  (this->path)._M_string_length = 0;
  (this->path).field_2._M_local_buf[0] = '\0';
  (this->http_version)._M_dataplus._M_p = (pointer)&(this->http_version).field_2;
  (this->http_version)._M_string_length = 0;
  (this->http_version).field_2._M_local_buf[0] = '\0';
  std::istream::istream(&this->content,&(this->content_buffer).super_streambuf);
  (this->header)._M_h._M_buckets = &(this->header)._M_h._M_single_bucket;
  (this->header)._M_h._M_bucket_count = 1;
  (this->header)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->header)._M_h._M_element_count = 0;
  (this->header)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [32])&(this->header)._M_h._M_rehash_policy._M_next_resize = ZEXT432(0) << 0x40;
  this->path_match = (smatch)(ZEXT432(0) << 0x40);
  boost::asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            (&this->content_buffer,0xffffffffffffffff,&local_39);
  return;
}

Assistant:

Request(): content(&content_buffer) {}